

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O2

QAction * __thiscall QToolBar::addWidget(QToolBar *this,QWidget *widget)

{
  QAction *action;
  
  action = (QAction *)operator_new(0x10);
  QWidgetAction::QWidgetAction((QWidgetAction *)action,(QObject *)this);
  QWidgetAction::setDefaultWidget((QWidgetAction *)action,widget);
  *(byte *)(*(long *)(action + 8) + 0x1d0) = *(byte *)(*(long *)(action + 8) + 0x1d0) | 2;
  QWidget::addAction(&this->super_QWidget,action);
  return action;
}

Assistant:

QAction *QToolBar::addWidget(QWidget *widget)
{
    QWidgetAction *action = new QWidgetAction(this);
    action->setDefaultWidget(widget);
    action->d_func()->autoCreated = true;
    addAction(action);
    return action;
}